

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmilankoviccalendar.cpp
# Opt level: O2

bool __thiscall QMilankovicCalendar::isLeapYear(QMilankovicCalendar *this,int year)

{
  bool bVar1;
  R_conflict16 RVar2;
  uint uVar3;
  
  uVar3 = (uint)(year < 1) + year;
  if ((uVar3 & 3) == 0) {
    RVar2 = QRoundingDown::qDivMod<100U,_int,_true>(uVar3);
    if (((ulong)RVar2 >> 0x20 == 0) &&
       (uVar3 = QRoundingDown::qMod<9u,int>(RVar2.quotient), (uVar3 & 0xfffb) != 2)) {
      bVar1 = false;
    }
    else {
      bVar1 = true;
    }
    return bVar1;
  }
  return false;
}

Assistant:

bool QMilankovicCalendar::isLeapYear(int year) const
{
    if (year == QCalendar::Unspecified)
        return false;
    if (year <= 0)
        ++year;
    if (qMod<4>(year))
        return false;
    const auto yeardm = qDivMod<100>(year);
    if (yeardm.remainder == 0) {
        const qint16 century = qMod<9>(yeardm.quotient);
        if (century != 2 && century != 6)
            return false;
    }
    return true;
}